

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::detail::
storage_t<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>::destruct_value
          (storage_t<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *this)

{
  void *pvVar1;
  
  std::
  vector<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
  ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
             *)(this + 0x20));
  pvVar1 = *(void **)this;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x10) - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }